

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

void sort_data_update_support(stagewise_poly *poly)

{
  example *peVar1;
  uint64_t uVar2;
  vw *pvVar3;
  sort_data *psVar4;
  bool bVar5;
  uint64_t uVar6;
  weight *pwVar7;
  long lVar8;
  ulong uVar9;
  uint32_t *puVar10;
  uint64_t pos;
  ulong uVar11;
  size_t wid;
  sort_data *__first;
  uint64_t i;
  long lVar12;
  float fVar13;
  
  peVar1 = poly->original_ec;
  uVar2 = (peVar1->super_example_predict).ft_offset;
  (poly->synth_ec).super_example_predict.ft_offset = 0;
  (peVar1->super_example_predict).ft_offset = 0;
  fVar13 = powf((float)poly->sum_input_sparsity / (float)poly->num_examples,poly->sched_exponent);
  uVar11 = 1L << ((byte)poly->all->num_bits & 0x3f);
  uVar9 = (long)(fVar13 - 9.223372e+18) & (long)fVar13 >> 0x3f | (long)fVar13;
  if (uVar9 <= uVar11) {
    uVar11 = uVar9;
  }
  sort_data_ensure_sz(poly,uVar11);
  __first = poly->sd;
  std::make_heap<sort_data*,int(*)(sort_data&,sort_data&)>(__first,__first,sort_data_compar_heap);
  for (lVar12 = 0; pvVar3 = poly->all, lVar12 != 1L << ((byte)pvVar3->num_bits & 0x3f);
      lVar12 = lVar12 + 1) {
    puVar10 = &(pvVar3->weights).dense_weights._stride_shift;
    if ((pvVar3->weights).sparse != false) {
      puVar10 = &(pvVar3->weights).sparse_weights._stride_shift;
    }
    wid = lVar12 << ((byte)*puVar10 & 0x3f);
    bVar5 = parent_get(poly,wid);
    if ((!bVar5) && (uVar6 = constant_feat_masked(poly), wid != uVar6)) {
      pwVar7 = parameters::operator[](&poly->all->weights,wid);
      fVar13 = *pwVar7;
      pwVar7 = parameters::operator[](&poly->all->weights,poly->all->normalized_idx + wid);
      fVar13 = ABS(fVar13) * *pwVar7;
      if (1e-09 < fVar13) {
        psVar4 = poly->sd;
        lVar8 = (long)__first - (long)psVar4 >> 4;
        if ((lVar8 == (int)uVar11) && (psVar4->weightsal <= fVar13 && fVar13 != psVar4->weightsal))
        {
          std::pop_heap<sort_data*,int(*)(sort_data&,sort_data&)>
                    (psVar4,__first,sort_data_compar_heap);
          __first = __first + -1;
          lVar8 = (long)__first - (long)poly->sd >> 4;
        }
        if (lVar8 < (int)uVar11) {
          __first->weightsal = fVar13;
          __first->wid = wid;
          __first = __first + 1;
          std::push_heap<sort_data*,int(*)(sort_data&,sort_data&)>
                    (poly->sd,__first,sort_data_compar_heap);
        }
      }
    }
  }
  psVar4 = poly->sd;
  lVar12 = 8;
  for (uVar11 = 0; (uVar11 < (ulong)((long)__first - (long)psVar4 >> 4) && (uVar11 < poly->sd_len));
      uVar11 = uVar11 + 1) {
    parent_toggle(poly,*(uint64_t *)((long)&poly->sd->weightsal + lVar12));
    lVar12 = lVar12 + 0x10;
  }
  (poly->original_ec->super_example_predict).ft_offset = uVar2;
  (poly->synth_ec).super_example_predict.ft_offset = uVar2;
  return;
}

Assistant:

void sort_data_update_support(stagewise_poly &poly)
{
  assert(poly.num_examples);

  // ft_offset affects parent_set / parent_get.  This state must be reset at end.
  uint64_t pop_ft_offset = poly.original_ec->ft_offset;
  poly.synth_ec.ft_offset = 0;
  assert(poly.original_ec);
  poly.original_ec->ft_offset = 0;

  size_t num_new_features = (size_t)pow(poly.sum_input_sparsity * 1.0f / poly.num_examples, poly.sched_exponent);
  num_new_features = (num_new_features > poly.all->length()) ? (uint64_t)poly.all->length() : num_new_features;
  sort_data_ensure_sz(poly, num_new_features);

  sort_data *heap_end = poly.sd;
  make_heap(poly.sd, heap_end, sort_data_compar_heap);  // redundant
  for (uint64_t i = 0; i != poly.all->length(); ++i)
  {
    uint64_t wid = stride_shift(poly, i);
    if (!parent_get(poly, wid) && wid != constant_feat_masked(poly))
    {
      float weightsal = (fabsf(poly.all->weights[wid]) * poly.all->weights[poly.all->normalized_idx + (wid)]);
      /*
       * here's some depth penalization code.  It was found to not improve
       * statistical performance, and meanwhile it is verified as giving
       * a nontrivial computational hit, thus commented out.
       *
       * - poly.magic_argument
       * sqrtf(min_depths_get(poly, stride_shift(poly, i)) * 1.0 / poly.num_examples)
       */
      ;
      if (weightsal > tolerance)
      {
        assert(heap_end >= poly.sd);
        assert(heap_end <= poly.sd + num_new_features);

        if (heap_end - poly.sd == (int)num_new_features && poly.sd->weightsal < weightsal)
        {
          pop_heap(poly.sd, heap_end, sort_data_compar_heap);
          --heap_end;
        }

        assert(heap_end >= poly.sd);
        assert(heap_end < poly.sd + poly.sd_len);

        if (heap_end - poly.sd < (int)num_new_features)
        {
          heap_end->weightsal = weightsal;
          heap_end->wid = wid;
          ++heap_end;
          push_heap(poly.sd, heap_end, sort_data_compar_heap);
        }
      }
    }
  }
  num_new_features = (uint64_t)(heap_end - poly.sd);

#ifdef DEBUG
  // eyeballing weights a pain if unsorted.
  qsort(poly.sd, num_new_features, sizeof(sort_data), sort_data_compar);
#endif  // DEBUG

  for (uint64_t pos = 0; pos < num_new_features && pos < poly.sd_len; ++pos)
  {
    assert(!parent_get(poly, poly.sd[pos].wid) && poly.sd[pos].weightsal > tolerance &&
        poly.sd[pos].wid != constant_feat_masked(poly));
    parent_toggle(poly, poly.sd[pos].wid);
#ifdef DEBUG
    cout << "Adding feature " << pos << "/" << num_new_features << " || wid " << poly.sd[pos].wid << " || sort value "
         << poly.sd[pos].weightsal << endl;
#endif  // DEBUG
  }

#ifdef DEBUG
  cout << "depths:";
  for (uint64_t depth = 0; depth <= poly.max_depth && depth < sizeof(poly.depths) / sizeof(*poly.depths); ++depth)
    cout << "  [" << depth << "] = " << poly.depths[depth];
  cout << endl;

  cout << "Sanity check after sort... " << flush;
  sanity_check_state(poly);
  cout << "done" << endl;
#endif  // DEBUG

  // it's okay that these may have been initially unequal; synth_ec value irrelevant so far.
  poly.original_ec->ft_offset = pop_ft_offset;
  poly.synth_ec.ft_offset = pop_ft_offset;
}